

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_parser.cpp
# Opt level: O3

bool __thiscall
dxil_spv::DXILContainerParser::parse_container
          (DXILContainerParser *this,void *data,size_t size,bool reflection)

{
  bool bVar1;
  bool bVar2;
  ssize_t sVar3;
  size_t sVar4;
  undefined7 in_register_00000009;
  size_t __nbytes;
  Vector<DXIL::IOElement> *elements;
  int iVar5;
  DXILContainerParser *pDVar6;
  ulong uVar7;
  uint *part_offset;
  pointer puVar8;
  FourCC expected;
  PartHeader part_header;
  Vector<uint32_t> parts;
  ContainerHeader container_header;
  MemoryStream stream;
  MemoryStream substream;
  int local_b8;
  uint local_b4;
  DXILContainerParser *local_b0;
  Vector<DXIL::IOElement> *local_a8;
  Vector<DXIL::IOElement> *local_a0;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_98;
  int local_80 [6];
  uint local_68;
  uint local_64;
  MemoryStream local_60;
  
  __nbytes = CONCAT71(in_register_00000009,reflection);
  MemoryStream::MemoryStream(&local_60,data,size);
  sVar3 = MemoryStream::read(&local_60,(int)local_80,(void *)0x20,__nbytes);
  if ((char)sVar3 == '\0') {
    return false;
  }
  if (local_80[0] != 0x43425844) {
    return false;
  }
  if (size < local_68) {
    return false;
  }
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
            (&local_98,(ulong)local_64,(allocator_type *)&stack0xffffffffffffffb8);
  if (local_64 != 0) {
    iVar5 = 0;
    uVar7 = 0;
    do {
      sVar3 = MemoryStream::read(&local_60,
                                 (int)local_98.
                                      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + iVar5,(void *)0x4,
                                 __nbytes);
      if ((char)sVar3 == '\0') goto LAB_0014c1f7;
      uVar7 = uVar7 + 1;
      iVar5 = iVar5 + 4;
    } while (uVar7 < local_64);
  }
  if (local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = true;
  }
  else {
    local_a0 = &this->output_elements;
    iVar5 = 0x4c495844;
    if (reflection) {
      iVar5 = 0x54415453;
    }
    local_a8 = &this->input_elements;
    puVar8 = local_98.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    local_b0 = this;
    do {
      bVar1 = MemoryStream::seek(&local_60,(ulong)*puVar8);
      if (!bVar1) break;
      sVar3 = MemoryStream::read(&local_60,(int)&local_b8,(void *)0x8,__nbytes);
      if ((char)sVar3 == '\0') goto LAB_0014c1f7;
      if (local_b8 < 0x4c495844) {
        pDVar6 = (DXILContainerParser *)&stack0xffffffffffffffb8;
        if (local_b8 == 0x31475349) {
          sVar4 = MemoryStream::get_offset(&local_60);
          __nbytes = (size_t)local_b4;
          MemoryStream::create_substream
                    ((MemoryStream *)&stack0xffffffffffffffb8,&local_60,sVar4,__nbytes);
          elements = local_a8;
LAB_0014c1df:
          bVar2 = parse_iosg1(pDVar6,(MemoryStream *)&stack0xffffffffffffffb8,elements);
          goto LAB_0014c1e4;
        }
        if (local_b8 == 0x3147534f) {
          sVar4 = MemoryStream::get_offset(&local_60);
          __nbytes = (size_t)local_b4;
          MemoryStream::create_substream
                    ((MemoryStream *)&stack0xffffffffffffffb8,&local_60,sVar4,__nbytes);
          elements = local_a0;
          goto LAB_0014c1df;
        }
      }
      else {
        if (local_b8 != 0x54415453) {
          if (local_b8 == 0x54414452) {
            sVar4 = MemoryStream::get_offset(&local_60);
            __nbytes = (size_t)local_b4;
            MemoryStream::create_substream
                      ((MemoryStream *)&stack0xffffffffffffffb8,&local_60,sVar4,__nbytes);
            bVar2 = parse_rdat(local_b0,(MemoryStream *)&stack0xffffffffffffffb8);
            goto LAB_0014c1e4;
          }
          if (local_b8 != 0x4c495844) goto LAB_0014c1e8;
        }
        if (iVar5 == local_b8) {
          sVar4 = MemoryStream::get_offset(&local_60);
          __nbytes = (size_t)local_b4;
          MemoryStream::create_substream
                    ((MemoryStream *)&stack0xffffffffffffffb8,&local_60,sVar4,__nbytes);
          bVar2 = parse_dxil(local_b0,(MemoryStream *)&stack0xffffffffffffffb8);
LAB_0014c1e4:
          if (bVar2 == false) goto LAB_0014c1f7;
        }
      }
LAB_0014c1e8:
      puVar8 = puVar8 + 1;
    } while (puVar8 != local_98.
                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
LAB_0014c203:
  if (local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (uint *)0x0) {
    free_in_thread(local_98.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
LAB_0014c1f7:
  bVar1 = false;
  goto LAB_0014c203;
}

Assistant:

bool DXILContainerParser::parse_container(const void *data, size_t size, bool reflection)
{
	MemoryStream stream(data, size);

	DXIL::ContainerHeader container_header;
	if (!stream.read(container_header))
		return false;

	if (static_cast<DXIL::FourCC>(container_header.header_fourcc) != DXIL::FourCC::Container)
		return false;
	if (container_header.container_size_in_bytes > size)
		return false;

	Vector<uint32_t> parts(container_header.part_count);
	for (uint32_t i = 0; i < container_header.part_count; i++)
	{
		if (!stream.read(parts[i]))
			return false;
	}

	for (auto &part_offset : parts)
	{
		if (!stream.seek(part_offset))
			return false;

		DXIL::PartHeader part_header;
		if (!stream.read(part_header))
			return false;

		auto fourcc = static_cast<DXIL::FourCC>(part_header.part_fourcc);
		switch (fourcc)
		{
		case DXIL::FourCC::DXIL:
		case DXIL::FourCC::ShaderStatistics:
		{
			DXIL::FourCC expected = reflection ? DXIL::FourCC::ShaderStatistics : DXIL::FourCC::DXIL;
			if (expected != fourcc)
				break;

			// The STAT block includes a DXIL blob that is literally the same DXIL IR
			// minus code + string names in the metadata chunks ... <__________________________________<
			auto substream = stream.create_substream(stream.get_offset(), part_header.part_size);
			if (!parse_dxil(substream))
				return false;
			break;
		}

		case DXIL::FourCC::FeatureInfo:
			break;

		case DXIL::FourCC::InputSignature:
		{
			auto substream = stream.create_substream(stream.get_offset(), part_header.part_size);
			if (!parse_iosg1(substream, input_elements))
				return false;
			break;
		}

		case DXIL::FourCC::OutputSignature:
		{
			auto substream = stream.create_substream(stream.get_offset(), part_header.part_size);
			if (!parse_iosg1(substream, output_elements))
				return false;
			break;
		}

		case DXIL::FourCC::PatchConstantSignature:
			break;

		case DXIL::FourCC::PrivateData:
			break;

		case DXIL::FourCC::RootSignature:
			break;

		case DXIL::FourCC::PipelineStateValidation:
			break;

		case DXIL::FourCC::ResourceDef:
			break;

		case DXIL::FourCC::ShaderHash:
			break;

		case DXIL::FourCC::RuntimeData:
		{
			auto substream = stream.create_substream(stream.get_offset(), part_header.part_size);
			if (!parse_rdat(substream))
				return false;
			break;
		}

		default:
			break;
		}
	}

	return true;
}